

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

optional<unsigned_long> __thiscall kratos::Simulator::get_value_(Simulator *this,Var *var)

{
  pointer puVar1;
  uint *puVar2;
  _func_int **pp_Var3;
  long lVar4;
  Var *var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer puVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  uint32_t uVar9;
  undefined4 extraout_var;
  pair<unsigned_int,_unsigned_int> pVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  const_iterator cVar13;
  mapped_type *__x;
  InternalException *pIVar14;
  undefined7 uVar16;
  ulong uVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  _Storage<unsigned_long,_true> unaff_R14;
  optional<unsigned_long> oVar17;
  string_view format_str;
  format_args args;
  pointer local_b8;
  pointer ppStack_b0;
  Var *local_a0;
  Var *var_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  undefined1 auStack_78 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  undefined1 local_58 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> result;
  Var *root;
  
  if (((var == (Var *)0x0) ||
      (puVar2 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start,
      (long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar2 != 4)) || (1 < *puVar2)) {
LAB_001cd7b9:
    this = (Simulator *)unaff_R14;
    uVar15 = 0;
  }
  else {
    uVar16 = (undefined7)((ulong)var >> 8);
    unaff_R14 = (_Storage<unsigned_long,_true>)this;
    local_a0 = var;
    switch(var->type_) {
    case Expression:
      eval_expr((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_58,
                this,var);
      if (result.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload.field2[0x10] != '\x01') goto LAB_001cd7b9;
      this = *(Simulator **)local_58;
      result.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] = 0;
      operator_delete((void *)local_58,
                      (long)result.
                            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_payload._M_value.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_58);
      break;
    case Slice:
      iVar8 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
      result.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _24_8_ = CONCAT44(extraout_var,iVar8);
      var_local = (Var *)0x0;
      values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((((Var *)result.
                   super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ._24_8_)->type_ == Parameter) ||
         (((Var *)result.
                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ._24_8_)->type_ == ConstValue)) {
        oVar17 = get_value_(this,var);
        local_58 = oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload;
        if (((undefined1  [16])
             oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) {
          pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
          (*(var->super_IRNode)._vptr_IRNode[0x20])(auStack_78,var);
          local_b8 = (pointer)auStack_78;
          ppStack_b0 = index.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          format_str.size_ = 0xd;
          format_str.data_ = (char *)0x1b;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_b8;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_58,(detail *)"Unable to get value for {0}",format_str,args);
          InternalException::InternalException(pIVar14,(string *)local_58);
          __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_assign_aux<unsigned_long_const*>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&var_local,local_58);
LAB_001cd88d:
        get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)auStack_78,this,var);
        if (auStack_78 ==
            (undefined1  [8])
            index.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar15 = 0;
        }
        else {
          pVar10 = compute_var_high_low
                             ((Var *)result.
                                     super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     ._24_8_,
                              (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               *)auStack_78);
          uVar7 = (**(code **)(*(long *)result.
                                        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        ._24_8_ + 0x38))();
          if (uVar7 < (pVar10.first - pVar10.second) + 1) {
            pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
            local_58 = (undefined1  [8])
                       ((long)&result.
                               super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               ._M_payload + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_58,"Unable to resolve variable slicing","");
            InternalException::InternalException(pIVar14,(string *)local_58);
            __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar7 = *(uint *)(result.
                            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._24_8_ + 0x98);
          this = (Simulator *)
                 (~(-1L << ((char)(((ulong)pVar10 & 0xffffffff) % (ulong)uVar7) + 1U & 0x3f)) &
                 (ulong)(&(var_local->super_IRNode)._vptr_IRNode)
                        [((ulong)pVar10 >> 0x20) / (ulong)uVar7] >>
                 ((byte)(((ulong)pVar10 >> 0x20) % (ulong)uVar7) & 0x3f));
          uVar15 = CONCAT71(pVar10._1_7_,1);
        }
        if (auStack_78 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_78,
                          (long)index.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
        }
      }
      else {
        puVar5 = (((Var *)result.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._24_8_)->size_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((long)(((Var *)result.
                            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._24_8_)->size_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar5 == 4) && (*puVar5 == 1)) {
          oVar17 = get_value_(this,(Var *)result.
                                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                          ._24_8_);
          if (((undefined1  [16])
               oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            local_58 = (undefined1  [8])
                       oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_payload;
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_assign_aux<unsigned_long_const*>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&var_local,local_58);
            goto LAB_001cd88d;
          }
        }
        else {
          cVar13 = std::
                   _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->complex_values_)._M_h,
                          (key_type *)
                          &result.
                           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           ._M_engaged);
          if (cVar13.
              super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            __x = std::
                  unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::at(&this->complex_values_,
                       (key_type *)
                       &result.
                        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ._M_engaged);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&var_local,__x);
            goto LAB_001cd88d;
          }
        }
        uVar15 = 0;
      }
      if (var_local != (Var *)0x0) {
        operator_delete(var_local,
                        (long)values.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)var_local);
      }
      goto LAB_001cd7bb;
    case ConstValue:
      if (*(int *)&var[1].super_IRNode.comment._M_dataplus._M_p != 0) {
        pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
        (*(var->super_IRNode)._vptr_IRNode[0x1f])(auStack_78,var);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"Big number evaluation not supported. Got ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_78);
        InternalException::InternalException(pIVar14,(string *)local_58);
        __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
    case Parameter:
      this = (Simulator *)((_Storage<unsigned_long,_true> *)(var + 1))->_M_value;
      break;
    default:
      iVar8 = (*(var->super_IRNode)._vptr_IRNode[0x1c])(var);
      if ((char)iVar8 == '\0') {
        cVar11 = std::
                 _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this,&local_a0);
        if (cVar11.
            super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>.
            _M_cur != (__node_type *)0x0) {
          pmVar12 = std::
                    unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                    ::at(&this->values_,&local_a0);
          this = (Simulator *)*pmVar12;
          break;
        }
      }
      else {
        pp_Var3 = var[1].super_IRNode._vptr_IRNode;
        cVar6 = (**(code **)(*pp_Var3 + 0x80))(pp_Var3);
        if (cVar6 != '\0') {
          puVar1 = (pointer)((long)&result.
                                    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    ._M_payload + 8);
          local_58 = (undefined1  [8])puVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,pp_Var3[0x1d],pp_Var3[0x1e] + (long)pp_Var3[0x1d]);
          iVar8 = std::__cxx11::string::compare((char *)local_58);
          if (local_58 != (undefined1  [8])puVar1) {
            operator_delete((void *)local_58,
                            (long)result.
                                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  ._M_payload._M_value.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 1);
          }
          if (iVar8 == 0) {
            lVar4 = *(long *)&var[1].super_IRNode.verilog_ln;
            var_00 = *(Var **)(lVar4 + 0x40);
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar4 + 0x48);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            oVar17 = get_value_(this,var_00);
            if (((undefined1  [16])
                 oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) {
              uVar9 = clog2(oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._M_payload._0_4_);
              this._4_4_ = 0;
              this._0_4_ = uVar9;
              uVar15 = CONCAT71(uVar16,1);
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              goto LAB_001cd7bb;
            }
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
          }
        }
      }
      goto LAB_001cd7b9;
    }
    uVar15 = CONCAT71(uVar16,1);
  }
LAB_001cd7bb:
  oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar15 & 0xffffffff;
  oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)(_Storage<unsigned_long,_true>)this;
  return (optional<unsigned_long>)
         oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> Simulator::get_value_(const kratos::Var *var) const {
    if (!var) return std::nullopt;
    // only scalar
    if (var->size().size() != 1 || var->size().front() > 1) return std::nullopt;

    if (var->type() == VarType::Parameter) {
        auto const *param = reinterpret_cast<const Param *>(var);
        return param->value();
    } else if (var->type() == VarType::ConstValue) {
        auto const *const_ = reinterpret_cast<const Const *>(var);
        if (const_->is_bignum())
            throw InternalException("Big number evaluation not supported. Got " +
                                    const_->to_string());
        return const_->value();
    } else if (var->type() == VarType::Expression) {
        auto result = eval_expr(var);
        if (result) {
            return (*result)[0];
        } else {
            return std::nullopt;
        }
    } else if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        std::vector<uint64_t> values;
        if (root->type() == VarType::ConstValue || root->type() == VarType::Parameter) {
            auto value = get_value_(var);
            if (!value)
                throw InternalException(
                    ::format("Unable to get value for {0}", var->handle_name()));
            values = {*value};
        } else if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            auto value = get_value_(root);
            if (!value) return std::nullopt;
            values = {*value};
        } else if (complex_values_.find(root) == complex_values_.end()) {
            return std::nullopt;
        } else {
            values = complex_values_.at(root);
        }
        // obtain the index
        auto index = get_slice_index(var);
        if (index.empty()) return std::nullopt;
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_high + 1 - var_low > root->width())
            throw InternalException("Unable to resolve variable slicing");
        auto base = var_low / root->var_width();
        auto low = var_low % root->var_width();
        auto high = var_high % root->var_width();
        auto value = values[base];
        return (value >> low) & (~(0xFFFFFFFFFFFFFFFF << (high + 1)));
    } else {
        // function call
        if (var->is_function()) {
            // only built-in function that can be statically evaluated is supported
            auto const *func_call_car = reinterpret_cast<const FunctionCallVar *>(var);
            auto *def = func_call_car->func();
            if (def->is_builtin() && def->function_name() == "clog2") {
                auto arg = func_call_car->args().begin()->second;
                auto v = get_value_(arg.get());
                if (v) return clog2(*v);
            }
            return std::nullopt;

        } else {
            if (values_.find(var) == values_.end())
                return std::nullopt;
            else
                return values_.at(var);
        }
    }
}